

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

Notation icu_63::number::impl::stem_to_object::notation(StemEnum stem)

{
  Notation NVar1;
  
  switch(stem) {
  case STEM_COMPACT_SHORT:
    NVar1 = Notation::compactShort();
    return NVar1;
  case STEM_COMPACT_LONG:
    NVar1 = Notation::compactLong();
    return NVar1;
  case STEM_SCIENTIFIC:
    NVar1 = (Notation)Notation::scientific();
    return NVar1;
  case STEM_ENGINEERING:
    NVar1 = (Notation)Notation::engineering();
    return NVar1;
  case STEM_NOTATION_SIMPLE:
    NVar1 = Notation::simple();
    return NVar1;
  default:
    return (Notation)ZEXT412(2);
  }
}

Assistant:

Notation stem_to_object::notation(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_COMPACT_SHORT:
            return Notation::compactShort();
        case STEM_COMPACT_LONG:
            return Notation::compactLong();
        case STEM_SCIENTIFIC:
            return Notation::scientific();
        case STEM_ENGINEERING:
            return Notation::engineering();
        case STEM_NOTATION_SIMPLE:
            return Notation::simple();
        default:
            U_ASSERT(false);
            return Notation::simple(); // return a value: silence compiler warning
    }
}